

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::Executor::Impl::processAsyncCancellations
          (Impl *this,Vector<kj::_::XThreadEvent_*> *eventsToCancelOutsideLock)

{
  XThreadEvent **ppXVar1;
  XThreadEvent **event;
  XThreadEvent **ppXVar2;
  Vector<kj::_::XThreadEvent_*> *__range2;
  Locked<kj::Executor::Impl::State> lock;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  ppXVar1 = (eventsToCancelOutsideLock->builder).pos;
  for (ppXVar2 = (eventsToCancelOutsideLock->builder).ptr; ppXVar2 != ppXVar1; ppXVar2 = ppXVar2 + 1
      ) {
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              (&((*ppXVar2)->promiseNode).ptr,&stack0xffffffffffffffc8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffc8);
    kj::_::Event::disarm(&(*ppXVar2)->super_Event);
  }
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)&stack0xffffffffffffffc8,this);
  ppXVar1 = (eventsToCancelOutsideLock->builder).pos;
  for (ppXVar2 = (eventsToCancelOutsideLock->builder).ptr; ppXVar2 != ppXVar1; ppXVar2 = ppXVar2 + 1
      ) {
    (*ppXVar2)->state = DONE;
  }
  Locked<kj::Executor::Impl::State>::~Locked
            ((Locked<kj::Executor::Impl::State> *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void processAsyncCancellations(Vector<_::XThreadEvent*>& eventsToCancelOutsideLock) {
    // After calling dispatchAll() or dispatchCancels() with the lock held, it may be that some
    // cancellations require dropping the lock before destroying the promiseNode. In that case
    // those cancellations will be added to the eventsToCancelOutsideLock Vector passed to the
    // method. That vector must then be passed to processAsyncCancellations() as soon as the lock
    // is released.

    for (auto& event: eventsToCancelOutsideLock) {
      event->promiseNode = kj::none;
      event->disarm();
    }

    // Now we need to mark all the events "done" under lock.
    auto lock = state.lockExclusive();
    for (auto& event: eventsToCancelOutsideLock) {
      event->setDoneState();
    }
  }